

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

Box ftxui::Box::Intersection(Box a,Box b)

{
  int iVar1;
  Box BVar2;
  int *piVar3;
  undefined8 local_38;
  Box b_local;
  Box a_local;
  
  a_local._0_8_ = a._8_8_;
  b_local._8_8_ = a._0_8_;
  b_local._0_8_ = b._8_8_;
  local_38 = b._0_8_;
  piVar3 = std::max<int>(&b_local.y_min,(int *)&local_38);
  a_local.y_min = *piVar3;
  piVar3 = std::min<int>(&b_local.y_max,(int *)((long)&local_38 + 4));
  a_local.y_max = *piVar3;
  piVar3 = std::max<int>(&a_local.x_min,&b_local.x_min);
  iVar1 = *piVar3;
  piVar3 = std::min<int>(&a_local.x_max,&b_local.x_max);
  BVar2.x_max = a_local.y_max;
  BVar2.x_min = a_local.y_min;
  BVar2.y_min = iVar1;
  BVar2.y_max = *piVar3;
  return BVar2;
}

Assistant:

Box Box::Intersection(Box a, Box b) {
  return Box{
      std::max(a.x_min, b.x_min),
      std::min(a.x_max, b.x_max),
      std::max(a.y_min, b.y_min),
      std::min(a.y_max, b.y_max),
  };
}